

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderMatrixCase::init(ShaderMatrixCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  string *__s;
  bool bVar2;
  OperationType OVar3;
  OperationNature OVar4;
  uint uVar5;
  TestMatrixType TVar6;
  int iVar7;
  ostream *poVar8;
  char *pcVar9;
  reference pbVar10;
  reference pvVar11;
  float *pfVar12;
  int precision;
  EVP_PKEY_CTX *ctx_00;
  char *local_870;
  char *local_808;
  string *local_760;
  ShaderInput *local_748;
  DataType local_73c;
  DataType local_738;
  ostream *local_720;
  int local_70c;
  uint local_708;
  int col;
  int row;
  int attribNdx_1;
  int local_6bc;
  string local_6b8 [4];
  int attribNdx;
  string local_698 [32];
  string local_678;
  string local_658;
  string local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_618;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_610;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_608;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_600;
  const_iterator copyIter;
  allocator<char> local_5d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  Matrix<float,_4,_4> local_58c;
  Matrix<float,_3,_3> local_54c;
  Matrix<float,_2,_2> local_528;
  string local_518;
  string local_4f8;
  allocator<char> local_4d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  allocator<char> local_489;
  value_type local_488;
  allocator<char> local_461;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  allocator<char> local_419;
  value_type local_418;
  string *local_3f8;
  string *inValue;
  char *typeName;
  char *precName;
  ShaderInput *in;
  int inNdx;
  DataType otherType;
  DataType matrixType;
  int matNdx;
  string operationValue1;
  string operationValue0;
  undefined1 local_380 [4];
  int numInputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  Precision resultPrec;
  DataType resultType;
  string inValue1;
  string inValue0;
  bool isInDynMat1;
  bool isInDynMat0;
  ostringstream *op;
  undefined1 local_300 [8];
  ostringstream frag;
  ostringstream vtx;
  ShaderMatrixCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_720 = (ostream *)local_300;
  }
  else {
    local_720 = (ostream *)&frag.field_0x170;
  }
  glu::isDataTypeMatrix((this->m_in0).dataType);
  glu::isDataTypeMatrix((this->m_in1).dataType);
  std::__cxx11::string::string((string *)(inValue1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&resultPrec);
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x5e;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (this->m_in0).precision;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_380);
  bVar2 = MatrixCaseUtils::isOperationBinary(this->m_op);
  iVar7 = 1;
  if (bVar2) {
    iVar7 = 2;
  }
  std::__cxx11::string::string((string *)(operationValue1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&matrixType);
  bVar2 = glu::isDataTypeMatrix((this->m_in0).dataType);
  if ((bVar2) && (bVar2 = glu::isDataTypeMatrix((this->m_in1).dataType), bVar2)) {
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->m_in0).dataType;
  }
  else {
    OVar3 = MatrixCaseUtils::getOperationType(this->m_op);
    if ((OVar3 == OPERATIONTYPE_UNARY_PREFIX_OPERATOR) ||
       (OVar3 = MatrixCaseUtils::getOperationType(this->m_op),
       OVar3 == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)) {
      passVars.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->m_in0).dataType;
    }
    else {
      bVar2 = glu::isDataTypeMatrix((this->m_in0).dataType);
      otherType = (DataType)!bVar2;
      if (otherType == TYPE_INVALID) {
        local_738 = (this->m_in0).dataType;
      }
      else {
        local_738 = (this->m_in1).dataType;
      }
      inNdx = local_738;
      if (otherType == TYPE_INVALID) {
        local_73c = (this->m_in1).dataType;
      }
      else {
        local_73c = (this->m_in0).dataType;
      }
      in._4_4_ = local_73c;
      if (local_73c == TYPE_FLOAT) {
        passVars.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_738;
      }
      else {
        passVars.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_73c;
      }
    }
  }
  std::operator<<((ostream *)&frag.field_0x170,"attribute highp vec4 a_position;\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    std::operator<<((ostream *)&frag.field_0x170,"varying mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_300,"varying mediump vec4 v_color;\n");
  }
  for (in._0_4_ = 0; (int)in < iVar7; in._0_4_ = (int)in + 1) {
    if ((int)in < 1) {
      local_748 = &this->m_in0;
    }
    else {
      local_748 = &this->m_in1;
    }
    precName = (char *)local_748;
    typeName = glu::getPrecisionName(local_748->precision);
    inValue = (string *)glu::getDataTypeName(*(DataType *)(precName + 4));
    if ((int)in < 1) {
      local_760 = (string *)((long)&inValue1.field_2 + 8);
    }
    else {
      local_760 = (string *)&resultPrec;
    }
    local_3f8 = local_760;
    if (*(int *)precName == 2) {
      poVar8 = std::operator<<((ostream *)&frag.field_0x170,"attribute ");
      poVar8 = std::operator<<(poVar8,typeName);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,(char *)inValue);
      std::operator<<(poVar8," a_");
      bVar2 = glu::isDataTypeMatrix(*(DataType *)(precName + 4));
      if (bVar2) {
        poVar8 = std::operator<<((ostream *)&frag.field_0x170,(char *)inValue);
        std::operator<<(poVar8,";\n");
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          poVar8 = std::operator<<((ostream *)&frag.field_0x170,"varying ");
          poVar8 = std::operator<<(poVar8,typeName);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          poVar8 = std::operator<<(poVar8," v_");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          std::operator<<(poVar8,";\n");
          poVar8 = std::operator<<((ostream *)local_300,"varying ");
          poVar8 = std::operator<<(poVar8,typeName);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          poVar8 = std::operator<<(poVar8," v_");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          std::operator<<(poVar8,";\n");
          __s = inValue;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_418,(char *)__s,&local_419);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_380,&local_418);
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator(&local_419);
        }
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          local_808 = "v_";
        }
        else {
          local_808 = "a_";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_460,local_808,&local_461);
        pcVar9 = glu::getDataTypeName(*(DataType *)(precName + 4));
        std::operator+(&local_440,&local_460,pcVar9);
        std::__cxx11::string::operator=(local_3f8,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::string::~string((string *)&local_460);
        std::allocator<char>::~allocator(&local_461);
      }
      else {
        std::operator<<((ostream *)&frag.field_0x170,"coords;\n");
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          poVar8 = std::operator<<((ostream *)&frag.field_0x170,"varying ");
          poVar8 = std::operator<<(poVar8,typeName);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          std::operator<<(poVar8," v_coords;\n");
          poVar8 = std::operator<<((ostream *)local_300,"varying ");
          poVar8 = std::operator<<(poVar8,typeName);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          std::operator<<(poVar8," v_coords;\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_488,"coords",&local_489);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_380,&local_488);
          std::__cxx11::string::~string((string *)&local_488);
          std::allocator<char>::~allocator(&local_489);
        }
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          local_870 = "v_coords";
        }
        else {
          local_870 = "a_coords";
        }
        std::__cxx11::string::operator=(local_3f8,local_870);
      }
    }
    else if (*(int *)precName == 1) {
      poVar8 = std::operator<<(local_720,"uniform ");
      poVar8 = std::operator<<(poVar8,typeName);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,(char *)inValue);
      poVar8 = std::operator<<(poVar8," u_in");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)in);
      std::operator<<(poVar8,";\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"u_in",&local_4d1);
      de::toString<int>(&local_4f8,(int *)&in);
      std::operator+(&local_4b0,&local_4d0,&local_4f8);
      std::__cxx11::string::operator=(local_3f8,(string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::allocator<char>::~allocator(&local_4d1);
    }
    else if (*(int *)precName == 0) {
      poVar8 = std::operator<<(local_720,"const ");
      poVar8 = std::operator<<(poVar8,typeName);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,(char *)inValue);
      poVar8 = std::operator<<(poVar8," in");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)in);
      std::operator<<(poVar8," = ");
      switch(*(undefined4 *)(precName + 4)) {
      case 1:
        de::floatToString_abi_cxx11_
                  (&local_518,(de *)&DAT_00000001,
                   *(float *)((long)&s_constInFloat + (long)(int)in * 4),precision);
        std::operator<<(local_720,(string *)&local_518);
        std::__cxx11::string::~string((string *)&local_518);
        break;
      case 2:
        MatrixCaseUtils::writeVectorConstructor<2>
                  (local_720,(Vector<float,_2> *)(s_constInVec2 + (long)(int)in * 8));
        break;
      case 3:
        MatrixCaseUtils::writeVectorConstructor<3>
                  (local_720,(Vector<float,_3> *)(s_constInVec3 + (long)(int)in * 0xc));
        break;
      case 4:
        MatrixCaseUtils::writeVectorConstructor<4>
                  (local_720,(Vector<float,_4> *)(s_constInVec4 + (long)(int)in * 0x10));
        break;
      case 5:
        tcu::Matrix<float,_2,_2>::Matrix
                  (&local_528,(Matrix<float,_2,_2> *)(s_constInMat2 + (long)(int)in * 0x10));
        MatrixCaseUtils::writeMatrixConstructor<2,2>(local_720,&local_528);
        tcu::Matrix<float,_2,_2>::~Matrix(&local_528);
        break;
      default:
        break;
      case 9:
        tcu::Matrix<float,_3,_3>::Matrix
                  (&local_54c,(Matrix<float,_3,_3> *)(s_constInMat3 + (long)(int)in * 0x24));
        MatrixCaseUtils::writeMatrixConstructor<3,3>(local_720,&local_54c);
        tcu::Matrix<float,_3,_3>::~Matrix(&local_54c);
        break;
      case 0xd:
        tcu::Matrix<float,_4,_4>::Matrix
                  (&local_58c,(Matrix<float,_4,_4> *)(s_constInMat4 + (long)(int)in * 0x40));
        MatrixCaseUtils::writeMatrixConstructor<4,4>(local_720,&local_58c);
        tcu::Matrix<float,_4,_4>::~Matrix(&local_58c);
      }
      std::operator<<(local_720,";\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"in",&local_5d1);
      de::toString<int>((string *)&copyIter,(int *)&in);
      std::operator+(&local_5b0,&local_5d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copyIter)
      ;
      std::__cxx11::string::operator=(local_3f8,(string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&copyIter);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::allocator<char>::~allocator(&local_5d1);
    }
  }
  poVar8 = std::operator<<((ostream *)&frag.field_0x170,"\n");
  poVar8 = std::operator<<(poVar8,"void main (void)\n");
  poVar8 = std::operator<<(poVar8,"{\n");
  std::operator<<(poVar8,"\tgl_Position = a_position;\n");
  poVar8 = std::operator<<((ostream *)local_300,"\n");
  poVar8 = std::operator<<(poVar8,"void main (void)\n");
  std::operator<<(poVar8,"{\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_608._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_380);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_600,&local_608);
    while( true ) {
      local_610._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_380);
      bVar2 = __gnu_cxx::operator!=(&local_600,&local_610);
      if (!bVar2) break;
      poVar8 = std::operator<<((ostream *)&frag.field_0x170,"\tv_");
      pbVar10 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_600);
      poVar8 = std::operator<<(poVar8,(string *)pbVar10);
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = std::operator<<(poVar8,"a_");
      pbVar10 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_600);
      poVar8 = std::operator<<(poVar8,(string *)pbVar10);
      std::operator<<(poVar8,";\n");
      local_618 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_600,0);
    }
  }
  else {
    std::operator<<((ostream *)local_300,"\tgl_FragColor = v_color;\n");
  }
  OVar4 = MatrixCaseUtils::getOperationNature(this->m_op);
  if (OVar4 == OPERATIONNATURE_PURE) {
    std::__cxx11::string::operator=
              ((string *)(operationValue1.field_2._M_local_buf + 8),
               (string *)(inValue1.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&matrixType,(string *)&resultPrec);
  }
  else if (OVar4 == OPERATIONNATURE_MUTATING) {
    poVar8 = std::operator<<(local_720,"\t");
    pcVar9 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," ");
    pcVar9 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," tmpValue = ");
    poVar8 = std::operator<<(poVar8,(string *)(inValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar8,";\n");
    std::__cxx11::string::operator=((string *)(operationValue1.field_2._M_local_buf + 8),"tmpValue")
    ;
    std::__cxx11::string::operator=((string *)&matrixType,(string *)&resultPrec);
  }
  else if (OVar4 == OPERATIONNATURE_ASSIGNMENT) {
    std::__cxx11::string::operator=
              ((string *)(operationValue1.field_2._M_local_buf + 8),
               (string *)(inValue1.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&matrixType,(string *)&resultPrec);
  }
  OVar3 = MatrixCaseUtils::getOperationType(this->m_op);
  switch(OVar3) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    poVar8 = std::operator<<(local_720,"\t");
    pcVar9 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," ");
    pcVar9 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    poVar8 = std::operator<<(poVar8," ");
    pcVar9 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,(string *)&matrixType);
    std::operator<<(poVar8,";\n");
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    poVar8 = std::operator<<(local_720,"\t");
    pcVar9 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," ");
    pcVar9 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," res = ");
    pcVar9 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = std::operator<<(poVar8,(string *)&matrixType);
    std::operator<<(poVar8,");\n");
    break;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    poVar8 = std::operator<<(local_720,"\t");
    pcVar9 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," ");
    pcVar9 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," res = ");
    pcVar9 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar8,";\n");
    break;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    poVar8 = std::operator<<(local_720,"\t");
    pcVar9 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," ");
    pcVar9 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    pcVar9 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::operator<<(poVar8,";\n");
    break;
  case OPERATIONTYPE_ASSIGNMENT:
    poVar8 = std::operator<<(local_720,"\t");
    pcVar9 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," ");
    pcVar9 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar8,";\n");
    poVar8 = std::operator<<(local_720,"\tres ");
    pcVar9 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,(string *)&matrixType);
    std::operator<<(poVar8,";\n");
  }
  poVar8 = std::operator<<(local_720,"\t");
  pcVar9 = "gl_FragColor";
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    pcVar9 = "v_color";
  }
  poVar8 = std::operator<<(poVar8,pcVar9);
  std::operator<<(poVar8," = ");
  bVar2 = MatrixCaseUtils::isOperationValueModifying(this->m_op);
  if (bVar2) {
    poVar8 = std::operator<<(local_720,"vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_638,this,
               (DataType *)
               ((long)&passVars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),"res");
    poVar8 = std::operator<<(poVar8,(string *)&local_638);
    poVar8 = std::operator<<(poVar8,", 1.0) + vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_658,this,
               (DataType *)
               ((long)&passVars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),"tmpValue");
    poVar8 = std::operator<<(poVar8,(string *)&local_658);
    std::operator<<(poVar8,", 0.0);\n");
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::string::~string((string *)&local_638);
  }
  else {
    poVar8 = std::operator<<(local_720,"vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_678,this,
               (DataType *)
               ((long)&passVars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),"res");
    poVar8 = std::operator<<(poVar8,(string *)&local_678);
    std::operator<<(poVar8,", 1.0);\n");
    std::__cxx11::string::~string((string *)&local_678);
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_300,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_698);
  std::__cxx11::string::~string(local_698);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_6b8);
  std::__cxx11::string::~string(local_6b8);
  ctx_00 = (EVP_PKEY_CTX *)&DAT_00000004;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (&(this->super_ShaderRenderCase).m_userAttribTransforms,4);
  for (local_6bc = 0; local_6bc < 4; local_6bc = local_6bc + 1) {
    row = 0;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&attribNdx_1,(float *)&row);
    pvVar11 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_6bc);
    tcu::Matrix<float,_4,_4>::operator=(pvVar11,(Matrix<float,_4,_4> *)&attribNdx_1);
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)&attribNdx_1);
    pvVar11 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_6bc);
    pfVar12 = tcu::Matrix<float,_4,_4>::operator()(pvVar11,local_6bc % 4,0);
    *pfVar12 = 1.0;
    pvVar11 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_6bc);
    uVar5 = local_6bc + 1U;
    if ((int)(local_6bc + 1U) < 0) {
      uVar5 = local_6bc + 4;
    }
    pfVar12 = tcu::Matrix<float,_4,_4>::operator()(pvVar11,(local_6bc + 1) - (uVar5 & 0xfffffffc),1)
    ;
    *pfVar12 = 1.0;
    pvVar11 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_6bc);
    uVar5 = local_6bc + 2U;
    if ((int)(local_6bc + 2U) < 0) {
      uVar5 = local_6bc + 5;
    }
    pfVar12 = tcu::Matrix<float,_4,_4>::operator()(pvVar11,(local_6bc + 2) - (uVar5 & 0xfffffffc),2)
    ;
    *pfVar12 = 1.0;
    pvVar11 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_6bc);
    uVar5 = local_6bc + 3U;
    if ((int)(local_6bc + 3U) < 0) {
      uVar5 = local_6bc + 6;
    }
    uVar5 = (local_6bc + 3) - (uVar5 & 0xfffffffc);
    ctx_00 = (EVP_PKEY_CTX *)(ulong)uVar5;
    pfVar12 = tcu::Matrix<float,_4,_4>::operator()(pvVar11,uVar5,3);
    *pfVar12 = 1.0;
  }
  TVar6 = MatrixCaseUtils::getOperationTestMatrixType(this->m_op);
  if (TVar6 != TESTMATRIXTYPE_DEFAULT) {
    for (col = 0; col < 4; col = col + 1) {
      for (local_708 = 0; (int)local_708 < 4; local_708 = local_708 + 1) {
        for (local_70c = 0; local_70c < 4; local_70c = local_70c + 1) {
          TVar6 = MatrixCaseUtils::getOperationTestMatrixType(this->m_op);
          if (TVar6 == TESTMATRIXTYPE_NEGATED) {
            pvVar11 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            pfVar12 = tcu::Matrix<float,_4,_4>::operator()(pvVar11,local_708,local_70c);
            fVar1 = *pfVar12;
            pvVar11 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            ctx_00 = (EVP_PKEY_CTX *)(ulong)local_708;
            pfVar12 = tcu::Matrix<float,_4,_4>::operator()(pvVar11,local_708,local_70c);
            *pfVar12 = -fVar1;
          }
          else if (TVar6 == TESTMATRIXTYPE_INCREMENTED) {
            pvVar11 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            ctx_00 = (EVP_PKEY_CTX *)(ulong)local_708;
            pfVar12 = tcu::Matrix<float,_4,_4>::operator()(pvVar11,local_708,local_70c);
            *pfVar12 = *pfVar12 + 0.3;
          }
          else if (TVar6 == TESTMATRIXTYPE_DECREMENTED) {
            pvVar11 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            ctx_00 = (EVP_PKEY_CTX *)(ulong)local_708;
            pfVar12 = tcu::Matrix<float,_4,_4>::operator()(pvVar11,local_708,local_70c);
            *pfVar12 = *pfVar12 - 0.1;
          }
        }
      }
    }
  }
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx_00);
  std::__cxx11::string::~string((string *)&matrixType);
  std::__cxx11::string::~string((string *)(operationValue1.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_380);
  std::__cxx11::string::~string((string *)&resultPrec);
  std::__cxx11::string::~string((string *)(inValue1.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
  iVar7 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return iVar7;
}

Assistant:

void ShaderMatrixCase::init (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = otherType;
		}
	}

	vtx << "attribute highp vec4 a_position;\n";
	if (m_isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}

	// Input declarations.
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			vtx << "attribute " << precName << " " << typeName << " a_";

			if (isDataTypeMatrix(in.dataType))
			{
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "varying " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "varying " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "varying " << precName << " " << typeName << " v_coords;\n";
					frag << "varying " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "uniform " << precName << " " << typeName << " u_in" << inNdx << ";\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2[inNdx]));		break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3[inNdx]));		break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
	{
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified.
	op << "	" << (m_isVertexCase ? "v_color" : "gl_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();

	// \todo [2012-02-14 pyry] Compute better values for matrix tests.
	m_userAttribTransforms.resize(4);
	for (int attribNdx = 0; attribNdx < 4; attribNdx++)
	{
		m_userAttribTransforms[attribNdx] = Mat4(0.0f);
		m_userAttribTransforms[attribNdx]((0 + attribNdx) % 4, 0) = 1.0f;
		m_userAttribTransforms[attribNdx]((1 + attribNdx) % 4, 1) = 1.0f;
		m_userAttribTransforms[attribNdx]((2 + attribNdx) % 4, 2) = 1.0f;
		m_userAttribTransforms[attribNdx]((3 + attribNdx) % 4, 3) = 1.0f;
	}

	// prevent bad reference cases such as black result images by fine-tuning used matrices
	if (getOperationTestMatrixType(m_op) != TESTMATRIXTYPE_DEFAULT)
	{
		for (int attribNdx = 0; attribNdx < 4; attribNdx++)
		{
			for (int row = 0; row < 4; row++)
			for (int col = 0; col < 4; col++)
			{
				switch (getOperationTestMatrixType(m_op))
				{
					case TESTMATRIXTYPE_NEGATED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col);
						break;
					case TESTMATRIXTYPE_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) += 0.3f;
						break;
					case TESTMATRIXTYPE_DECREMENTED:
						m_userAttribTransforms[attribNdx](row, col) -= 0.1f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
						break;
				}
			}
		}
	}

	ShaderRenderCase::init();
}